

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> __thiscall
spdlog::details::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
          (details *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  pattern_formatter *this_00;
  string local_98;
  string local_78;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  this_00 = (pattern_formatter *)operator_new(0xe0);
  pcVar1 = (args->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + args->_M_string_length);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"\n","");
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_bucket_count = 1;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  pattern_formatter::pattern_formatter(this_00,&local_78,local,&local_98,(custom_flags *)&local_58);
  *(pattern_formatter **)this = this_00;
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args) {
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}